

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O2

void __thiscall
gutil::Properties::getValue<double>(Properties *this,char *key,double *value,double *defvalue)

{
  IOException *this_00;
  allocator local_241;
  string v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  istringstream in;
  byte abStack_180 [352];
  
  v._M_dataplus._M_p = (pointer)&v.field_2;
  v._M_string_length = 0;
  v.field_2._M_local_buf[0] = '\0';
  getString(this,key,&v,"");
  *value = *defvalue;
  if (v._M_string_length != 0) {
    std::__cxx11::istringstream::istringstream((istringstream *)&in,(string *)&v,_S_in);
    std::istream::_M_extract<double>((double *)&in);
    if ((abStack_180[*(long *)(_in + -0x18)] & 5) != 0) {
      this_00 = (IOException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&local_220,key,&local_241);
      std::operator+(&local_200,"Format error: ",&local_220);
      std::operator+(&local_1e0,&local_200,"=");
      std::operator+(&local_1c0,&local_1e0,&v);
      IOException::IOException(this_00,&local_1c0);
      __cxa_throw(this_00,&IOException::typeinfo,Exception::~Exception);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)&in);
  }
  std::__cxx11::string::~string((string *)&v);
  return;
}

Assistant:

void getValue(const char *key, T &value,
                                     const T &defvalue) const
    {
      std::string v;

      getString(key, v, "");

      value=defvalue;

      if (v.size() > 0)
      {
        std::istringstream in(v);
        in >> value;

        if (in.fail())
        {
          throw IOException("Format error: "+std::string(key)+"="+v);
        }
      }
    }